

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob-filter.c++
# Opt level: O2

bool __thiscall kj::GlobFilter::matches(GlobFilter *this,StringPtr name)

{
  Vector<unsigned_int> *this_00;
  char c;
  uint *puVar1;
  size_t sVar2;
  ulong uVar3;
  uint *puVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  char *pcVar8;
  Vector<unsigned_int> scratch;
  int local_8c;
  char *local_88;
  char *local_80;
  ArrayBuilder<unsigned_int> local_78;
  ArrayBuilder<unsigned_int> local_58;
  
  pcVar8 = name.content.ptr;
  this_00 = &this->states;
  Vector<unsigned_int>::resize(this_00,0);
  local_58.ptr = (uint *)((ulong)local_58.ptr._4_4_ << 0x20);
  Vector<unsigned_int>::add<int>(this_00,(int *)&local_58);
  local_58.ptr = (uint *)0x0;
  local_58.pos = (RemoveConst<unsigned_int> *)0x0;
  local_58.endPtr = (uint *)0x0;
  local_58.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_88 = pcVar8 + (name.content.size_ - 1);
  while (pcVar8 != local_88) {
    c = *pcVar8;
    local_78.ptr = (this->states).builder.ptr;
    local_78.pos = (this->states).builder.pos;
    local_78.endPtr = (this->states).builder.endPtr;
    local_78.disposer = (this->states).builder.disposer;
    (this_00->builder).ptr = (uint *)0x0;
    (this->states).builder.pos = (RemoveConst<unsigned_int> *)0x0;
    (this->states).builder.endPtr = (uint *)0x0;
    local_80 = pcVar8;
    ArrayBuilder<unsigned_int>::operator=(&this_00->builder,&local_58);
    Vector<unsigned_int>::resize(this_00,0);
    if ((c == '\\') || (puVar4 = local_78.ptr, puVar1 = local_78.pos, c == '/')) {
      local_8c = 0;
      Vector<unsigned_int>::add<int>(this_00,&local_8c);
      puVar4 = local_78.ptr;
      puVar1 = local_78.pos;
    }
    for (; puVar4 != puVar1; puVar4 = puVar4 + 1) {
      applyState(this,c,*puVar4);
    }
    ArrayBuilder<unsigned_int>::operator=(&local_58,&local_78);
    ArrayBuilder<unsigned_int>::dispose(&local_78);
    pcVar8 = local_80 + 1;
  }
  puVar1 = (this->states).builder.ptr;
  puVar4 = (this->states).builder.pos;
  sVar2 = (this->pattern).content.size_;
  uVar3 = 0;
  if (sVar2 != 0) {
    uVar3 = sVar2 - 1;
  }
  do {
    puVar6 = puVar1;
    if (puVar6 == puVar4) break;
    uVar5 = *puVar6;
    do {
      uVar7 = (ulong)uVar5;
      if (uVar3 <= uVar7) break;
      uVar5 = uVar5 + 1;
    } while ((this->pattern).content.ptr[uVar7] == '*');
    puVar1 = puVar6 + 1;
  } while (uVar3 != uVar7);
  ArrayBuilder<unsigned_int>::dispose(&local_58);
  return puVar6 != puVar4;
}

Assistant:

bool GlobFilter::matches(StringPtr name) {
  // Get out your computer science books. We're implementing a non-deterministic finite automaton.
  //
  // Our NDFA has one "state" corresponding to each character in the pattern.
  //
  // As you may recall, an NDFA can be transformed into a DFA where every state in the DFA
  // represents some combination of states in the NDFA. Therefore, we actually have to store a
  // list of states here. (Actually, what we really want is a set of states, but because our
  // patterns are mostly non-cyclic a list of states should work fine and be a bit more efficient.)

  // Our state list starts out pointing only at the start of the pattern.
  states.resize(0);
  states.add(0);

  Vector<uint> scratch;

  // Iterate through each character in the name.
  for (char c: name) {
    // Pull the current set of states off to the side, so that we can populate `states` with the
    // new set of states.
    Vector<uint> oldStates = kj::mv(states);
    states = kj::mv(scratch);
    states.resize(0);

    // The pattern can omit a leading path. So if we're at a '/' then enter the state machine at
    // the beginning on the next char.
    if (c == '/' || c == '\\') {
      states.add(0);
    }

    // Process each state.
    for (uint state: oldStates) {
      applyState(c, state);
    }

    // Store the previous state vector for reuse.
    scratch = kj::mv(oldStates);
  }

  // If any one state is at the end of the pattern (or at a wildcard just before the end of the
  // pattern), we have a match.
  for (uint state: states) {
    while (state < pattern.size() && pattern[state] == '*') {
      ++state;
    }
    if (state == pattern.size()) {
      return true;
    }
  }
  return false;
}